

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatLabel
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t labelId)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  Error EVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  
  uVar6 = (ulong)(labelId - 0x100);
  uVar1 = (emitter->_code->_labels).super_ZoneVectorBase._length;
  if (uVar6 < uVar1) {
    pvVar2 = (emitter->_code->_labels).super_ZoneVectorBase._data;
    lVar3 = *(long *)((long)pvVar2 + uVar6 * 8);
    if (lVar3 != 0) {
      uVar7 = *(uint *)(lVar3 + 0x30);
      if (uVar7 == 0) {
        pcVar8 = "L%u";
        goto LAB_0011020f;
      }
      if (*(int *)(lVar3 + 0x14) == 0) goto LAB_00110269;
      uVar6 = (ulong)(*(int *)(lVar3 + 0x14) - 0x100);
      if ((uVar6 < uVar1) && (lVar4 = *(long *)((long)pvVar2 + uVar6 * 8), lVar4 != 0)) {
        if (*(uint *)(lVar4 + 0x30) == 0) {
          pcVar8 = "L%u";
          goto LAB_00110229;
        }
        if (*(uint *)(lVar4 + 0x30) < 0xc) {
          pcVar8 = (char *)(lVar4 + 0x34);
        }
        else {
          pcVar8 = *(char **)(lVar4 + 0x38);
        }
        EVar5 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
      }
      else {
        pcVar8 = "InvalidLabel[Id=%u]";
        uVar6 = (ulong)labelId;
LAB_00110229:
        EVar5 = StringBuilder::appendFormat(sb,pcVar8,uVar6);
      }
      if (EVar5 == 0) {
        EVar5 = StringBuilder::_opChar(sb,1,'.');
        if (EVar5 == 0) {
          uVar7 = *(uint *)(lVar3 + 0x30);
LAB_00110269:
          if (uVar7 < 0xc) {
            pcVar8 = (char *)(lVar3 + 0x34);
          }
          else {
            pcVar8 = *(char **)(lVar3 + 0x38);
          }
          EVar5 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
          return EVar5;
        }
      }
      return EVar5;
    }
  }
  pcVar8 = "InvalidLabel[Id=%u]";
  uVar6 = (ulong)labelId;
LAB_0011020f:
  EVar5 = StringBuilder::appendFormat(sb,pcVar8,uVar6);
  return EVar5;
}

Assistant:

Error Logging::formatLabel(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t labelId) noexcept {

  const LabelEntry* le = emitter->getCode()->getLabelEntry(labelId);
  if (ASMJIT_UNLIKELY(!le))
    return sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId));

  if (le->hasName()) {
    if (le->hasParent()) {
      uint32_t parentId = le->getParentId();
      const LabelEntry* pe = emitter->getCode()->getLabelEntry(parentId);

      if (ASMJIT_UNLIKELY(!pe))
        ASMJIT_PROPAGATE(sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId)));
      else if (ASMJIT_UNLIKELY(!pe->hasName()))
        ASMJIT_PROPAGATE(sb.appendFormat("L%u", Operand::unpackId(parentId)));
      else
        ASMJIT_PROPAGATE(sb.appendString(pe->getName()));

      ASMJIT_PROPAGATE(sb.appendChar('.'));
    }
    return sb.appendString(le->getName());
  }
  else {
    return sb.appendFormat("L%u", Operand::unpackId(labelId));
  }
}